

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c.cc
# Opt level: O3

uint32_t leveldb::crc32c::Extend(uint32_t crc,char *data,size_t n)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  int iVar6;
  uint *puVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint *puVar11;
  long lVar12;
  uint *puVar13;
  uint *puVar14;
  uint uVar15;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((Extend(unsigned_int,char_const*,unsigned_long)::accelerate == '\0') &&
     (iVar6 = __cxa_guard_acquire(), iVar6 != 0)) {
    uVar4 = ::crc32c::Extend(0,(uint8_t *)"TestCRCBuffer",0xd);
    Extend::accelerate = uVar4 == 0xdcbc59fa;
    __cxa_guard_release(&Extend(unsigned_int,char_const*,unsigned_long)::accelerate);
  }
  if (Extend::accelerate == true) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      uVar4 = ::crc32c::Extend(crc,(uint8_t *)data,n);
      return uVar4;
    }
  }
  else {
    puVar13 = (uint *)(data + n);
    uVar15 = ~crc;
    puVar7 = (uint *)((ulong)(data + 3) & 0xfffffffffffffffc);
    puVar14 = (uint *)data;
    if ((long)puVar7 - (long)data != 0 && puVar7 <= puVar13) {
      do {
        puVar11 = (uint *)((long)puVar14 + 1);
        uVar15 = uVar15 >> 8 ^
                 *(uint *)((anonymous_namespace)::kByteExtensionTable +
                          (ulong)((uint)(byte)*puVar14 ^ uVar15 & 0xff) * 4);
        puVar14 = puVar11;
      } while (puVar11 != puVar7);
      puVar14 = (uint *)(data + ((long)puVar7 - (long)data));
      data = (char *)puVar7;
    }
    if (0xf < (long)puVar13 - (long)data) {
      uVar15 = uVar15 ^ *puVar14;
      uVar5 = puVar14[1];
      uVar8 = puVar14[2];
      uVar9 = puVar14[3];
      puVar14 = puVar14 + 4;
      for (lVar12 = (long)puVar13 - (long)puVar14; 0xf < lVar12; lVar12 = lVar12 + -0x10) {
        uVar15 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 +
                          (ulong)(uVar15 & 0xff) * 4) ^ *puVar14 ^
                 *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                          (ulong)(uVar15 >> 8 & 0xff) * 4) ^
                 *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar15 >> 0xe & 0x3fc))
                 ^ *(uint *)((anonymous_namespace)::kStrideExtensionTable0 +
                            (ulong)(uVar15 >> 0x18) * 4);
        uVar5 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar5 & 0xff) * 4)
                ^ puVar14[1] ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                         (ulong)(uVar5 >> 8 & 0xff) * 4) ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar5 >> 0xe & 0x3fc)) ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar5 >> 0x18) * 4
                         );
        uVar8 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar8 & 0xff) * 4)
                ^ puVar14[2] ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                         (ulong)(uVar8 >> 8 & 0xff) * 4) ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar8 >> 0xe & 0x3fc)) ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar8 >> 0x18) * 4
                         );
        uVar9 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar9 & 0xff) * 4)
                ^ puVar14[3] ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                         (ulong)(uVar9 >> 8 & 0xff) * 4) ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar9 >> 0xe & 0x3fc)) ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar9 >> 0x18) * 4
                         );
        puVar14 = puVar14 + 4;
      }
      if (3 < lVar12) {
        lVar12 = (long)puVar13 - (long)puVar14;
        uVar10 = uVar15;
        uVar2 = uVar5;
        uVar3 = uVar8;
        do {
          uVar8 = uVar9;
          uVar5 = uVar3;
          uVar15 = uVar2;
          uVar9 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 +
                           (ulong)(uVar10 & 0xff) * 4) ^ *puVar14 ^
                  *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                           (ulong)(uVar10 >> 8 & 0xff) * 4) ^
                  *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar10 >> 0xe & 0x3fc))
                  ^ *(uint *)((anonymous_namespace)::kStrideExtensionTable0 +
                             (ulong)(uVar10 >> 0x18) * 4);
          puVar14 = puVar14 + 1;
          lVar12 = lVar12 + -4;
          uVar10 = uVar15;
          uVar2 = uVar5;
          uVar3 = uVar8;
        } while (3 < lVar12);
      }
      lVar12 = 4;
      do {
        uVar15 = uVar15 >> 8 ^
                 *(uint *)((anonymous_namespace)::kByteExtensionTable + ((ulong)uVar15 & 0xff) * 4);
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
      uVar15 = uVar15 ^ uVar5;
      lVar12 = 4;
      do {
        uVar15 = uVar15 >> 8 ^
                 *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(uVar15 & 0xff) * 4);
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
      uVar15 = uVar15 ^ uVar8;
      lVar12 = 4;
      do {
        uVar15 = uVar15 >> 8 ^
                 *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(uVar15 & 0xff) * 4);
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
      uVar15 = uVar15 ^ uVar9;
      lVar12 = 4;
      do {
        uVar15 = uVar15 >> 8 ^
                 *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(uVar15 & 0xff) * 4);
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
    }
    for (; puVar14 != puVar13; puVar14 = (uint *)((long)puVar14 + 1)) {
      uVar15 = uVar15 >> 8 ^
               *(uint *)((anonymous_namespace)::kByteExtensionTable +
                        (ulong)((uint)(byte)*puVar14 ^ uVar15 & 0xff) * 4);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return ~uVar15;
    }
  }
  __stack_chk_fail();
}

Assistant:

uint32_t Extend(uint32_t crc, const char* data, size_t n) {
  static bool accelerate = CanAccelerateCRC32C();
  if (accelerate) {
    return port::AcceleratedCRC32C(crc, data, n);
  }

  const uint8_t* p = reinterpret_cast<const uint8_t*>(data);
  const uint8_t* e = p + n;
  uint32_t l = crc ^ kCRC32Xor;

// Process one byte at a time.
#define STEP1                              \
  do {                                     \
    int c = (l & 0xff) ^ *p++;             \
    l = kByteExtensionTable[c] ^ (l >> 8); \
  } while (0)

// Process one of the 4 strides of 4-byte data.
#define STEP4(s)                                                               \
  do {                                                                         \
    crc##s = ReadUint32LE(p + s * 4) ^ kStrideExtensionTable3[crc##s & 0xff] ^ \
             kStrideExtensionTable2[(crc##s >> 8) & 0xff] ^                    \
             kStrideExtensionTable1[(crc##s >> 16) & 0xff] ^                   \
             kStrideExtensionTable0[crc##s >> 24];                             \
  } while (0)

// Process a 16-byte swath of 4 strides, each of which has 4 bytes of data.
#define STEP16 \
  do {         \
    STEP4(0);  \
    STEP4(1);  \
    STEP4(2);  \
    STEP4(3);  \
    p += 16;   \
  } while (0)

// Process 4 bytes that were already loaded into a word.
#define STEP4W(w)                                   \
  do {                                              \
    w ^= l;                                         \
    for (size_t i = 0; i < 4; ++i) {                \
      w = (w >> 8) ^ kByteExtensionTable[w & 0xff]; \
    }                                               \
    l = w;                                          \
  } while (0)

  // Point x at first 4-byte aligned byte in the buffer. This might be past the
  // end of the buffer.
  const uint8_t* x = RoundUp<4>(p);
  if (x <= e) {
    // Process bytes p is 4-byte aligned.
    while (p != x) {
      STEP1;
    }
  }

  if ((e - p) >= 16) {
    // Load a 16-byte swath into the stride partial results.
    uint32_t crc0 = ReadUint32LE(p + 0 * 4) ^ l;
    uint32_t crc1 = ReadUint32LE(p + 1 * 4);
    uint32_t crc2 = ReadUint32LE(p + 2 * 4);
    uint32_t crc3 = ReadUint32LE(p + 3 * 4);
    p += 16;

    // It is possible to get better speeds (at least on x86) by interleaving
    // prefetching 256 bytes ahead with processing 64 bytes at a time. See the
    // portable implementation in https://github.com/google/crc32c/.

    // Process one 16-byte swath at a time.
    while ((e - p) >= 16) {
      STEP16;
    }

    // Advance one word at a time as far as possible.
    while ((e - p) >= 4) {
      STEP4(0);
      uint32_t tmp = crc0;
      crc0 = crc1;
      crc1 = crc2;
      crc2 = crc3;
      crc3 = tmp;
      p += 4;
    }

    // Combine the 4 partial stride results.
    l = 0;
    STEP4W(crc0);
    STEP4W(crc1);
    STEP4W(crc2);
    STEP4W(crc3);
  }

  // Process the last few bytes.
  while (p != e) {
    STEP1;
  }
#undef STEP4W
#undef STEP16
#undef STEP4
#undef STEP1
  return l ^ kCRC32Xor;
}